

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O3

void __thiscall CLayers::Init(CLayers *this,IKernel *pKernel,IMap *pMap)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (pMap == (IMap *)0x0) {
    iVar1 = (*pKernel->_vptr_IKernel[2])(pKernel,"map");
    pMap = (IMap *)CONCAT44(extraout_var,iVar1);
  }
  this->m_pMap = pMap;
  (*(pMap->super_IInterface)._vptr_IInterface[6])(pMap,4,&this->m_GroupsStart,this);
  (*(this->m_pMap->super_IInterface)._vptr_IInterface[6])
            (this->m_pMap,5,&this->m_LayersStart,&this->m_LayersNum);
  InitGameLayer(this);
  InitTilemapSkip(this);
  return;
}

Assistant:

void CLayers::Init(class IKernel *pKernel, IMap *pMap)
{
	m_pMap = pMap ? pMap : pKernel->RequestInterface<IMap>();
	m_pMap->GetType(MAPITEMTYPE_GROUP, &m_GroupsStart, &m_GroupsNum);
	m_pMap->GetType(MAPITEMTYPE_LAYER, &m_LayersStart, &m_LayersNum);

	InitGameLayer();
	InitTilemapSkip();
}